

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void cppcms::util::escape(char *begin,char *end,ostream *output)

{
  int iVar1;
  
  if ((*(streambuf **)(output + *(long *)(*(long *)output + -0x18) + 0xe8) != (streambuf *)0x0) &&
     ((*(uint *)(output + *(long *)(*(long *)output + -0x18) + 0x20) & 5) == 0)) {
    iVar1 = escape(begin,end,*(streambuf **)(output + *(long *)(*(long *)output + -0x18) + 0xe8));
    if (iVar1 != 0) {
      std::ios::clear((int)output + (int)*(undefined8 *)(*(long *)output + -0x18));
      return;
    }
  }
  return;
}

Assistant:

void escape(char const *begin,char const *end,std::ostream &output)
{
	std::streambuf *buf = output.rdbuf();
	if(!output || !buf)
		return;
	if(escape(begin,end,*buf)!=0)
		output.setstate(std::ios_base::failbit);
}